

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void nn_print_help(nn_parse_context *ctx,FILE *stream)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  nn_option *pnVar6;
  size_t sVar7;
  char *str;
  size_t width;
  size_t width_00;
  char *pcVar8;
  long lVar9;
  
  fwrite("Usage:\n",7,1,(FILE *)stream);
  fprintf((FILE *)stream,"    %s ",*ctx->argv);
  pnVar6 = ctx->options;
  if (pnVar6->longname != (char *)0x0) {
    bVar3 = true;
    lVar9 = 0x58;
    do {
      if ((pnVar6->mask_set & ctx->requires) != 0) {
        pcVar8 = "{--%s";
        if (!bVar3) {
          pcVar8 = "|--%s";
        }
        bVar3 = false;
        fprintf((FILE *)stream,pcVar8);
      }
      plVar1 = (long *)((long)&ctx->options->longname + lVar9);
      pnVar6 = (nn_option *)((long)&ctx->options->longname + lVar9);
      lVar9 = lVar9 + 0x58;
    } while (*plVar1 != 0);
    if (!bVar3) {
      fwrite("} ",2,1,(FILE *)stream);
    }
  }
  pnVar6 = ctx->options;
  if (pnVar6->longname != (char *)0x0) {
    bVar3 = true;
    lVar9 = 0x58;
    do {
      if ((((pnVar6->mask_set & ctx->requires) == 0) && (pnVar6->shortname != '\0')) &&
         (iVar4 = nn_has_arg(pnVar6), iVar4 == 0)) {
        if (bVar3) {
          bVar3 = false;
          fprintf((FILE *)stream,"[-%c");
        }
        else {
          fputc((int)pnVar6->shortname,(FILE *)stream);
          bVar3 = false;
        }
      }
      pnVar6 = (nn_option *)((long)&ctx->options->longname + lVar9);
      plVar1 = (long *)((long)&ctx->options->longname + lVar9);
      lVar9 = lVar9 + 0x58;
    } while (*plVar1 != 0);
    if (!bVar3) {
      fwrite("] ",2,1,(FILE *)stream);
    }
  }
  pnVar6 = ctx->options;
  if (pnVar6->longname != (char *)0x0) {
    lVar9 = 0x58;
    do {
      if ((((pnVar6->mask_set & ctx->requires) == 0) && (pnVar6->shortname != '\0')) &&
         ((iVar4 = nn_has_arg(pnVar6), iVar4 != 0 && (pnVar6->metavar != (char *)0x0)))) {
        fprintf((FILE *)stream,"[-%c %s] ",(ulong)(uint)(int)pnVar6->shortname);
      }
      pnVar6 = (nn_option *)((long)&ctx->options->longname + lVar9);
      plVar1 = (long *)((long)&ctx->options->longname + lVar9);
      lVar9 = lVar9 + 0x58;
    } while (*plVar1 != 0);
  }
  fwrite("[options] \n",0xb,1,(FILE *)stream);
  fprintf((FILE *)stream,"\n%s\n",ctx->def->short_description);
  pnVar6 = ctx->options;
  if (pnVar6->longname != (char *)0x0) {
    lVar9 = 0;
    pcVar8 = (char *)0x0;
    do {
      if (((pcVar8 == (char *)0x0) || (pcVar8 != pnVar6->group)) ||
         (iVar4 = strcmp(pcVar8,pnVar6->group), iVar4 != 0)) {
        fputc(10,(FILE *)stream);
        fprintf((FILE *)stream,"%s:\n",pnVar6->group);
        pcVar8 = pnVar6->group;
      }
      fprintf((FILE *)stream," --%s",pnVar6->longname);
      sVar7 = strlen(pnVar6->longname);
      if (pnVar6->shortname == '\0') {
        iVar4 = (int)sVar7 + 3;
      }
      else {
        fprintf((FILE *)stream,",-%c");
        iVar4 = (int)sVar7 + 6;
      }
      iVar5 = nn_has_arg(pnVar6);
      if (iVar5 != 0) {
        if (pnVar6->metavar == (char *)0x0) {
          fwrite(" ARG",4,1,(FILE *)stream);
          iVar4 = iVar4 + 4;
        }
        else {
          fprintf((FILE *)stream," %s");
          sVar7 = strlen(pnVar6->metavar);
          iVar4 = iVar4 + (int)sVar7 + 1;
        }
      }
      if (iVar4 < 0x17) {
        fputs("\n                        " + (long)iVar4 + 1,(FILE *)stream);
        str = nn_print_line(stream,pnVar6->description,width);
      }
      else {
        str = pnVar6->description;
      }
      cVar2 = *str;
      while (cVar2 != '\0') {
        fwrite("\n                        ",0x19,1,(FILE *)stream);
        str = nn_print_line(stream,str,width_00);
        cVar2 = *str;
      }
      fputc(10,(FILE *)stream);
      lVar9 = lVar9 + 1;
      pnVar6 = ctx->options + lVar9;
    } while (ctx->options[lVar9].longname != (char *)0x0);
  }
  return;
}

Assistant:

static void nn_print_help (struct nn_parse_context *ctx, FILE *stream)
{
    int i;
    int optlen;
    struct nn_option *opt;
    char *last_group;
    char *cursor;

    fprintf (stream, "Usage:\n");
    nn_print_usage (ctx, stream);
    fprintf (stream, "\n%s\n", ctx->def->short_description);

    last_group = NULL;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!last_group || last_group != opt->group ||
            strcmp (last_group, opt->group))
        {
            fprintf (stream, "\n");
            fprintf (stream, "%s:\n", opt->group);
            last_group = opt->group;
        }
        fprintf (stream, " --%s", opt->longname);
        optlen = 3 + strlen (opt->longname);
        if (opt->shortname) {
            fprintf (stream, ",-%c", opt->shortname);
            optlen += 3;
        }
        if (nn_has_arg (opt)) {
            if (opt->metavar) {
                fprintf (stream, " %s", opt->metavar);
                optlen += strlen (opt->metavar) + 1;
            } else {
                fprintf (stream, " ARG");
                optlen += 4;
            }
        }
        if (optlen < 23) {
            fputs (&"                        "[optlen], stream);
            cursor = nn_print_line (stream, opt->description, 80-24);
        } else {
            cursor = opt->description;
        }
        while (*cursor) {
            fprintf (stream, "\n                        ");
            cursor = nn_print_line (stream, cursor, 80-24);
        }
        fprintf (stream, "\n");
    }
}